

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::assign(CImgList<unsigned_char> *this,uint n)

{
  undefined8 *puVar1;
  CImg<unsigned_char> *pCVar2;
  void *pvVar3;
  ulong *puVar4;
  CImgList<unsigned_char> *pCVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  if (n != 0) {
    if (this->_allocated_width < n || n * 4 < this->_allocated_width) {
      pCVar2 = this->_data;
      if (pCVar2 != (CImg<unsigned_char> *)0x0) {
        if (pCVar2[-1]._data != (uchar *)0x0) {
          lVar7 = (long)pCVar2[-1]._data << 5;
          do {
            if ((*(char *)((long)pCVar2 + lVar7 + -0x10) == '\0') &&
               (pvVar3 = *(void **)((long)&pCVar2[-1]._data + lVar7), pvVar3 != (void *)0x0)) {
              operator_delete__(pvVar3);
            }
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != 0);
        }
        operator_delete__(&pCVar2[-1]._data);
      }
      uVar8 = 1;
      do {
        uVar6 = uVar8;
        uVar8 = uVar6 * 2;
      } while (uVar6 < n);
      uVar8 = 0x10;
      if (0x10 < (uint)uVar6) {
        uVar8 = uVar6 & 0xffffffff;
      }
      this->_allocated_width = (uint)uVar8;
      puVar4 = (ulong *)operator_new__(uVar8 * 0x20 + 8);
      *puVar4 = uVar8;
      lVar7 = 0;
      do {
        *(undefined8 *)((long)puVar4 + lVar7 + 0x20) = 0;
        puVar1 = (undefined8 *)((long)puVar4 + lVar7 + 8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined1 *)((long)puVar4 + lVar7 + 0x18) = 0;
        lVar7 = lVar7 + 0x20;
      } while (uVar8 * 0x20 != lVar7);
      this->_data = (CImg<unsigned_char> *)(puVar4 + 1);
    }
    this->_width = n;
    return this;
  }
  pCVar5 = assign(this);
  return pCVar5;
}

Assistant:

CImgList<T>& assign(const unsigned int n) {
      if (!n) return assign();
      if (_allocated_width<n || _allocated_width>(n<<2)) {
        delete[] _data;
        _data = new CImg<T>[_allocated_width = std::max(16U,(unsigned int)cimg::nearest_pow2(n))];
      }
      _width = n;
      return *this;
    }